

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

Property * __thiscall camp::Class::property(Class *this,size_t index)

{
  size_type sVar1;
  OutOfRange *__return_storage_ptr__;
  size_type size;
  __shared_ptr_access<camp::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  OutOfRange local_60;
  size_type local_18;
  size_t index_local;
  Class *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  sVar1 = boost::multi_index::detail::
          random_access_index<boost::multi_index::detail::nth_layer<1,_std::shared_ptr<camp::Property>,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::const_mem_fun<camp::Property,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Property::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::shared_ptr<camp::Property>_>_>,_boost::mpl::v_item<camp::Class::Id,_boost::mpl::vector0<mpl_::na>,_0>_>
          ::size(&(this->m_properties).super_type);
  if (sVar1 <= index) {
    __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
    sVar1 = local_18;
    size = boost::multi_index::detail::
           random_access_index<boost::multi_index::detail::nth_layer<1,_std::shared_ptr<camp::Property>,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::const_mem_fun<camp::Property,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Property::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::shared_ptr<camp::Property>_>_>,_boost::mpl::v_item<camp::Class::Id,_boost::mpl::vector0<mpl_::na>,_0>_>
           ::size(&(this->m_properties).super_type);
    OutOfRange::OutOfRange(&local_60,sVar1,size);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
               ,&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b8,"const Property &camp::Class::property(std::size_t) const",&local_b9);
    Error::prepare<camp::OutOfRange>
              (__return_storage_ptr__,&local_60,(string *)local_90,0x74,(string *)local_b8);
    __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,OutOfRange::~OutOfRange);
  }
  this_00 = (__shared_ptr_access<camp::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            boost::multi_index::detail::
            random_access_index<boost::multi_index::detail::nth_layer<1,_std::shared_ptr<camp::Property>,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Class::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Class::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::const_mem_fun<camp::Property,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_&camp::Property::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::shared_ptr<camp::Property>_>_>,_boost::mpl::v_item<camp::Class::Id,_boost::mpl::vector0<mpl_::na>,_0>_>
            ::operator[](&(this->m_properties).super_type,local_18);
  peVar2 = std::__shared_ptr_access<camp::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(this_00);
  return peVar2;
}

Assistant:

const Property& Class::property(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_properties.size())
        CAMP_ERROR(OutOfRange(index, m_properties.size()));

    return *m_properties[index];
}